

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O3

int equal_route(route_t *a,route_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->id,b->id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->agency_id,b->agency_id);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->short_name,b->short_name);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->long_name,b->long_name);
        uVar2 = uVar3;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->desc,b->desc);
          if (iVar1 == 0) {
            iVar1 = strcmp(a->url,b->url);
            if (iVar1 == 0) {
              iVar1 = strcmp(a->color,b->color);
              if (iVar1 == 0) {
                iVar1 = strcmp(a->text_color,b->text_color);
                if ((iVar1 == 0) && (a->type == b->type)) {
                  uVar2 = (uint)(a->sort_order == b->sort_order);
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_route(const route_t *a, const route_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->agency_id, b->agency_id) &&
             !strcmp(a->short_name, b->short_name) &&
             !strcmp(a->long_name, b->long_name) &&
             !strcmp(a->desc, b->desc) &&
             !strcmp(a->url, b->url) &&
             !strcmp(a->color, b->color) &&
             !strcmp(a->text_color, b->text_color) &&
             a->type == b->type &&
             a->sort_order == b->sort_order);
}